

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O1

int __thiscall ncnn::Softmax::load_param(Softmax *this,ParamDict *pd)

{
  int iVar1;
  int iVar2;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->axis = iVar1;
  iVar2 = ParamDict::get(pd,1,0);
  iVar1 = 0;
  if ((iVar2 == 0) && (iVar1 = 0, this->axis != 0)) {
    load_param();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Softmax::load_param(const ParamDict& pd)
{
    axis = pd.get(0, 0);

    // the original softmax handle axis on 3-dim blob incorrectly
    // ask user to regenerate param instead of producing wrong result
    int fixbug0 = pd.get(1, 0);
    if (fixbug0 == 0 && axis != 0)
    {
        fprintf(stderr, "param is too old, please regenerate!\n");
        return -1;
    }

    return 0;
}